

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4.h
# Opt level: O0

CMatrix4<float> * __thiscall
irr::core::CMatrix4<float>::setRotationRadians(CMatrix4<float> *this,vector3d<float> *rotation)

{
  float *in_RSI;
  CMatrix4<float> *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  f64 crsp;
  f64 srsp;
  f64 sy;
  f64 cy;
  f64 sp;
  f64 cp;
  f64 sr;
  f64 cr;
  
  dVar1 = cos((double)*in_RSI);
  dVar2 = sin((double)*in_RSI);
  dVar3 = cos((double)in_RSI[1]);
  dVar4 = sin((double)in_RSI[1]);
  dVar5 = cos((double)in_RSI[2]);
  dVar6 = sin((double)in_RSI[2]);
  in_RDI->M[0] = (float)(dVar3 * dVar5);
  in_RDI->M[1] = (float)(dVar3 * dVar6);
  in_RDI->M[2] = (float)-dVar4;
  in_RDI->M[4] = (float)(dVar2 * dVar4 * dVar5 + -(dVar1 * dVar6));
  in_RDI->M[5] = (float)(dVar2 * dVar4 * dVar6 + dVar1 * dVar5);
  in_RDI->M[6] = (float)(dVar2 * dVar3);
  in_RDI->M[8] = (float)(dVar1 * dVar4 * dVar5 + dVar2 * dVar6);
  in_RDI->M[9] = (float)(dVar1 * dVar4 * dVar6 + -(dVar2 * dVar5));
  in_RDI->M[10] = (float)(dVar1 * dVar3);
  return in_RDI;
}

Assistant:

inline CMatrix4<T> &CMatrix4<T>::setRotationRadians(const vector3d<T> &rotation)
{
	const f64 cr = cos(rotation.X);
	const f64 sr = sin(rotation.X);
	const f64 cp = cos(rotation.Y);
	const f64 sp = sin(rotation.Y);
	const f64 cy = cos(rotation.Z);
	const f64 sy = sin(rotation.Z);

	M[0] = (T)(cp * cy);
	M[1] = (T)(cp * sy);
	M[2] = (T)(-sp);

	const f64 srsp = sr * sp;
	const f64 crsp = cr * sp;

	M[4] = (T)(srsp * cy - cr * sy);
	M[5] = (T)(srsp * sy + cr * cy);
	M[6] = (T)(sr * cp);

	M[8] = (T)(crsp * cy + sr * sy);
	M[9] = (T)(crsp * sy - sr * cy);
	M[10] = (T)(cr * cp);
#if defined(USE_MATRIX_TEST)
	definitelyIdentityMatrix = false;
#endif
	return *this;
}